

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O1

FileInfoWrapper<ASDCP::PCM::MXFReader,_MyAudioDescriptor> * __thiscall
FileInfoWrapper<ASDCP::PCM::MXFReader,_MyAudioDescriptor>::file_info
          (FileInfoWrapper<ASDCP::PCM::MXFReader,_MyAudioDescriptor> *this,CommandOptions *Options,
          char *type_string,IFileReaderFactory *fileReaderFactory,FILE *stream)

{
  MXFReader Reader;
  WriterInfo WI;
  MyAudioDescriptor Desc;
  undefined1 local_1f0 [16];
  WriterInfo local_1e0;
  AudioDescriptor local_130 [2];
  AudioDescriptor local_c8;
  
  if (type_string != (char *)0x0) {
    if (stream == (FILE *)0x0) {
      stream = (FILE *)_stdout;
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    if ((Options->verbose_flag != false) || (Options->showheader_flag == true)) {
      ASDCP::PCM::MXFReader::MXFReader((MXFReader *)local_1f0,fileReaderFactory);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_130,Options->filenames[0],(allocator<char> *)&local_c8);
      ASDCP::PCM::MXFReader::OpenRead((string *)(local_1f0 + 0x10));
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)(local_1f0 + 0x10));
      Kumu::Result_t::~Result_t((Result_t *)(local_1f0 + 0x10));
      if (local_130[0].EditRate != (Rational)&local_130[0].Locked) {
        operator_delete((void *)local_130[0].EditRate,local_130[0]._16_8_ + 1);
      }
      if (*(int *)this < 0) {
        if ((*(int *)this == ASDCP::RESULT_FORMAT) && (Options->showheader_flag == true)) {
          ASDCP::PCM::MXFReader::DumpHeaderMetadata((_IO_FILE *)local_1f0);
        }
      }
      else {
        fprintf(_stdout,"File essence type is %s.\n",type_string);
        if (Options->showheader_flag == true) {
          ASDCP::PCM::MXFReader::DumpHeaderMetadata((_IO_FILE *)local_1f0);
        }
        ASDCP::WriterInfo::WriterInfo((WriterInfo *)(local_1f0 + 0x10));
        ASDCP::PCM::MXFReader::FillWriterInfo((WriterInfo *)&stack0xffffffffffffff68);
        Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
        ASDCP::WriterInfoDump((WriterInfo *)(local_1f0 + 0x10),(_IO_FILE *)stream);
        local_c8.EditRate.Numerator = 0;
        local_c8.EditRate.Denominator = 0;
        local_c8.AudioSamplingRate.Numerator = 0;
        local_c8.AudioSamplingRate.Denominator = 0;
        ASDCP::PCM::MXFReader::FillAudioDescriptor(local_130);
        Kumu::Result_t::~Result_t((Result_t *)local_130);
        ASDCP::PCM::AudioDescriptorDump(&local_c8,(_IO_FILE *)stream);
        if (Options->showindex_flag == true) {
          ASDCP::PCM::MXFReader::DumpIndex((_IO_FILE *)local_1f0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0.ProductName._M_dataplus._M_p != &local_1e0.ProductName.field_2) {
          operator_delete(local_1e0.ProductName._M_dataplus._M_p,
                          local_1e0.ProductName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0.CompanyName._M_dataplus._M_p != &local_1e0.CompanyName.field_2) {
          operator_delete(local_1e0.CompanyName._M_dataplus._M_p,
                          local_1e0.CompanyName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0.ProductVersion._M_dataplus._M_p != &local_1e0.ProductVersion.field_2) {
          operator_delete(local_1e0.ProductVersion._M_dataplus._M_p,
                          (ulong)(local_1e0.ProductVersion.field_2._M_allocated_capacity + 1));
        }
      }
      ASDCP::PCM::MXFReader::~MXFReader((MXFReader *)local_1f0);
    }
    return this;
  }
  __assert_fail("type_string",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/asdcp-test.cpp"
                ,0x6f0,
                "static Result_t FileInfoWrapper<ASDCP::PCM::MXFReader, MyAudioDescriptor>::file_info(CommandOptions &, const char *, const Kumu::IFileReaderFactory &, FILE *) [ReaderT = ASDCP::PCM::MXFReader, DescriptorT = MyAudioDescriptor]"
               );
}

Assistant:

static Result_t
  file_info(CommandOptions& Options, const char* type_string, const Kumu::IFileReaderFactory& fileReaderFactory, FILE* stream = 0)
  {
    assert(type_string);
    if ( stream == 0 )
      stream = stdout;

    Result_t result = RESULT_OK;

    if ( Options.verbose_flag || Options.showheader_flag )
      {
	ReaderT     Reader(fileReaderFactory);
	result = Reader.OpenRead(Options.filenames[0]);

	if ( ASDCP_SUCCESS(result) )
	  {
	    fprintf(stdout, "File essence type is %s.\n", type_string);

	    if ( Options.showheader_flag )
	      Reader.DumpHeaderMetadata(stream);

	    WriterInfo WI;
	    Reader.FillWriterInfo(WI);
	    WriterInfoDump(WI, stream);

	    DescriptorT Desc;
	    Desc.FillDescriptor(Reader);
	    Desc.Dump(stream);

	    if ( Options.showindex_flag )
	      Reader.DumpIndex(stream);
	  }
	else if ( result == RESULT_FORMAT && Options.showheader_flag )
	  {
	    Reader.DumpHeaderMetadata(stream);
	  }
      }

    return result;
  }